

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ParseLiteral
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars,RegexFlags *flags)

{
  RegexFlags RVar1;
  CharCount CVar2;
  EncodedChar *pEVar3;
  code *pcVar4;
  CharCount CVar5;
  HRESULT HVar6;
  bool bVar7;
  undefined4 *puVar8;
  Node *pNVar9;
  ParseError *pPVar10;
  ulong uVar11;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb40,"(input != 0)","input != 0");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb41,"(inputLim >= input)","inputLim >= input");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  DisjunctionPass0(this,0);
  uVar11 = (long)this->next - (long)input;
  if (this->next < input || 0xfffffffd < (long)uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  *outBodyEncodedChars = (CharCount)(uVar11 >> 1);
  uVar11 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0xfffffffd < (long)uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  *outBodyChars = (CharCount)(uVar11 >> 1);
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  if (*this->next != L'/') {
    Fail(this,-0x7ff5fc0c);
  }
  if (this->inputLim < this->next + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  this->next = this->next + 1;
  Options(this,flags);
  RVar1 = *flags;
  bVar7 = (bool)(RVar1 >> 3 & 1);
  this->unicodeFlagPresent = bVar7;
  this->caseInsensitiveFlagPresent = (bool)(RVar1 & IgnoreCaseRegexFlag);
  this->dotAllFlagPresent = (bool)(RVar1 >> 5 & 1);
  if ((bVar7 != false) && (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb54,
                       "(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())"
                       ,
                       "!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()"
                      );
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  if ((this->deferredIfNotUnicodeError != (ParseError *)0x0) && (this->unicodeFlagPresent == false))
  {
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar10 = this->deferredIfNotUnicodeError;
LAB_00ed3459:
    CVar2 = pPVar10->pos;
    CVar5 = pPVar10->encodedPos;
    HVar6 = pPVar10->error;
    *puVar8 = *(undefined4 *)pPVar10;
    puVar8[1] = CVar2;
    puVar8[2] = CVar5;
    puVar8[3] = HVar6;
    __cxa_throw(puVar8,&ParseError::typeinfo,0);
  }
  if ((this->deferredIfUnicodeError != (ParseError *)0x0) && (this->unicodeFlagPresent == true)) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar10 = this->deferredIfUnicodeError;
    goto LAB_00ed3459;
  }
  pEVar3 = this->next;
  this->currentSurrogatePairNode = this->surrogatePairList;
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  pNVar9 = DisjunctionPass1(this);
  CVar2 = *outBodyEncodedChars;
  uVar11 = (long)this->next - (long)input;
  if (this->next < input || 0xfffffffd < (long)uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  if (CVar2 != (CharCount)(uVar11 >> 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb68,"(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input))",
                       "outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input)");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  CVar2 = *outBodyChars;
  uVar11 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0xfffffffd < (long)uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  if (CVar2 != (CharCount)(uVar11 >> 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb69,"(outBodyChars == Pos())","outBodyChars == Pos()");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  this->next = pEVar3;
  if (pEVar3 < input || 0xfffffffd < (long)pEVar3 - (long)input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) goto LAB_00ed3437;
    *puVar8 = 0;
  }
  *outTotalEncodedChars = (CharCount)((ulong)((long)pEVar3 - (long)input) >> 1);
  uVar11 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0xfffffffd < (long)uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar7) {
LAB_00ed3437:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  *outTotalChars = (CharCount)(uVar11 >> 1);
  return pNVar9;
}

Assistant:

Node* Parser<P, IsLiteral>::ParseLiteral
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars
        , RegexFlags& flags )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // To handle surrogate pairs properly under unicode option, we will collect information on location of the pairs
        // during pass 0, regardless if the option is present. (We aren't able to get it at that time)
        // During pass 1, we will use that information to correctly create appropriate nodes.

        // Body, pass 0
        SetPosition(input, inputLim, true);

        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options are needed for the next pass
        ECMust('/', ERRnoSlash);
        Options(flags);
        this->unicodeFlagPresent = (flags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (flags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (flags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        Assert(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }

        // Used below to proceed to the end of the regex
        const EncodedChar *pastOptions = next;

        this->currentSurrogatePairNode = this->surrogatePairList;

        // Body, pass 1
        SetPosition(input, inputLim, true);
        Node* root = PatternPass1();
        Assert(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input));
        Assert(outBodyChars == Pos());

        next = pastOptions;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        return root;
    }